

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::sse42::
     BVHNIntersector1<4,_1,_false,_embree::sse42::ArrayIntersector1<embree::sse42::TriangleMIntersector1Moeller<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  IntersectFunc *pp_Var2;
  float *pfVar3;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar4;
  undefined1 auVar5 [16];
  Intersectors *pIVar6;
  Geometry *pGVar7;
  RTCIntersectArguments *pRVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  int iVar11;
  undefined1 (*pauVar12) [16];
  undefined1 (*pauVar13) [16];
  ulong uVar14;
  ulong uVar15;
  int *piVar16;
  RTCRayQueryContext *pRVar17;
  undefined8 uVar18;
  ulong uVar19;
  Intersectors *pIVar20;
  ulong uVar21;
  byte bVar22;
  long lVar23;
  ulong uVar24;
  float fVar25;
  uint uVar26;
  float fVar36;
  float fVar38;
  vint4 bi;
  undefined1 auVar27 [16];
  uint uVar37;
  uint uVar39;
  float fVar40;
  uint uVar41;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  vint4 bi_1;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  float fVar44;
  float fVar48;
  float fVar51;
  vint4 ai;
  uint uVar45;
  float fVar46;
  uint uVar49;
  float fVar50;
  uint uVar52;
  float fVar53;
  uint uVar54;
  float fVar55;
  undefined1 auVar47 [16];
  float fVar58;
  float fVar59;
  vint4 ai_1;
  undefined1 auVar56 [16];
  float fVar60;
  undefined1 auVar57 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  float fVar63;
  float fVar64;
  float fVar68;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  ulong local_1188;
  int local_115c;
  undefined1 local_1158 [16];
  float local_1148;
  undefined4 uStack_1144;
  undefined4 uStack_1140;
  undefined4 uStack_113c;
  float local_1138;
  float fStack_1134;
  float fStack_1130;
  float fStack_112c;
  RTCFilterFunctionNArguments local_1128;
  Geometry *local_10f8;
  Scene *local_10f0;
  float local_10e8;
  undefined4 local_10e4;
  float local_10e0;
  float local_10dc;
  float local_10d8;
  undefined4 local_10d4;
  uint local_10d0;
  uint local_10cc;
  uint local_10c8;
  float local_10b8 [4];
  float local_10a8;
  float fStack_10a4;
  float fStack_10a0;
  float fStack_109c;
  float local_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  undefined1 local_1088 [16];
  undefined1 local_1068 [16];
  float local_1058 [4];
  float local_1048 [4];
  float local_1038 [4];
  undefined1 local_1028 [16];
  undefined1 local_1018 [16];
  float local_1008 [4];
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  uint local_f88;
  uint uStack_f84;
  uint uStack_f80;
  uint uStack_f7c;
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_f78 != 8) {
    pauVar12 = (undefined1 (*) [16])local_f68;
    uStack_f70 = 0;
    fVar94 = (ray->super_RayK<1>).org.field_0.m128[0];
    fVar95 = (ray->super_RayK<1>).org.field_0.m128[1];
    auVar47._0_4_ = (ray->super_RayK<1>).org.field_0.m128[2];
    fVar58 = *(float *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
    aVar4 = (ray->super_RayK<1>).dir.field_0.field_1;
    fVar64 = (ray->super_RayK<1>).tfar;
    fVar68 = 0.0;
    if (0.0 <= fVar64) {
      fVar68 = fVar64;
    }
    auVar27._4_4_ = -(uint)(ABS(aVar4.y) < DAT_01f80d30._4_4_);
    auVar27._0_4_ = -(uint)(ABS(aVar4.x) < (float)DAT_01f80d30);
    auVar27._8_4_ = -(uint)(ABS(aVar4.z) < DAT_01f80d30._8_4_);
    auVar27._12_4_ = -(uint)(ABS(aVar4.field_3.w) < DAT_01f80d30._12_4_);
    auVar56 = blendvps((undefined1  [16])aVar4,_DAT_01f80d30,auVar27);
    fVar64 = 0.0;
    if (0.0 <= fVar58) {
      fVar64 = fVar58;
    }
    auVar27 = rcpps(auVar27,auVar56);
    fVar80 = auVar27._0_4_;
    fVar82 = auVar27._4_4_;
    fVar84 = auVar27._8_4_;
    fVar80 = (1.0 - auVar56._0_4_ * fVar80) * fVar80 + fVar80;
    fVar82 = (1.0 - auVar56._4_4_ * fVar82) * fVar82 + fVar82;
    fVar84 = (1.0 - auVar56._8_4_ * fVar84) * fVar84 + fVar84;
    bVar9 = fVar80 < 0.0;
    uVar19 = (ulong)(fVar82 < 0.0) << 4 | 0x20;
    uVar24 = (ulong)(fVar84 < 0.0) << 4 | 0x40;
    _local_f88 = mm_lookupmask_ps._240_8_;
    _uStack_f80 = mm_lookupmask_ps._248_8_;
    local_f98 = auVar47._0_4_;
    fStack_f94 = auVar47._0_4_;
    fStack_f90 = auVar47._0_4_;
    fStack_f8c = auVar47._0_4_;
    local_fa8 = fVar64;
    fStack_fa4 = fVar64;
    fStack_fa0 = fVar64;
    fStack_f9c = fVar64;
    local_fb8 = fVar84;
    fStack_fb4 = fVar84;
    fStack_fb0 = fVar84;
    fStack_fac = fVar84;
    local_fc8 = fVar94;
    fStack_fc4 = fVar94;
    fStack_fc0 = fVar94;
    fStack_fbc = fVar94;
    local_fd8 = fVar95;
    fStack_fd4 = fVar95;
    fStack_fd0 = fVar95;
    fStack_fcc = fVar95;
    local_fe8 = fVar80;
    fStack_fe4 = fVar80;
    fStack_fe0 = fVar80;
    fStack_fdc = fVar80;
    local_ff8 = fVar82;
    fStack_ff4 = fVar82;
    fStack_ff0 = fVar82;
    fStack_fec = fVar82;
    fVar50 = fVar68;
    fVar46 = fVar68;
    fVar58 = fVar68;
    fVar106 = fVar82;
    fVar104 = fVar82;
    fVar102 = fVar82;
    fVar99 = fVar80;
    fVar76 = fVar80;
    fVar100 = fVar80;
    fVar63 = fVar95;
    fVar55 = fVar95;
    fVar93 = fVar95;
    fVar91 = fVar94;
    fVar89 = fVar94;
    fVar87 = fVar94;
    fVar85 = fVar84;
    fVar83 = fVar84;
    fVar81 = fVar84;
    fVar79 = fVar64;
    fVar78 = fVar64;
    fVar77 = fVar64;
    fVar75 = auVar47._0_4_;
    fVar60 = auVar47._0_4_;
    fVar59 = auVar47._0_4_;
LAB_00d8cda9:
    do {
      pauVar13 = pauVar12 + -1;
      pauVar12 = pauVar12 + -1;
      pfVar1 = &(ray->super_RayK<1>).tfar;
      if (*(float *)((long)*pauVar13 + 8) < *pfVar1 || *(float *)((long)*pauVar13 + 8) == *pfVar1) {
        pIVar20 = *(Intersectors **)*pauVar12;
        while (((ulong)pIVar20 & 8) == 0) {
          pp_Var2 = &(pIVar20->intersector1).intersect + (ulong)bVar9 * 2;
          fVar25 = (*(float *)pp_Var2 - fVar87) * fVar100;
          fVar36 = (*(float *)((long)pp_Var2 + 4) - fVar89) * fVar76;
          fVar38 = (*(float *)(pp_Var2 + 1) - fVar91) * fVar99;
          fVar40 = (*(float *)((long)pp_Var2 + 0xc) - fVar94) * fVar80;
          pfVar1 = (float *)((long)&(pIVar20->intersector1).intersect + uVar19);
          fVar44 = (*pfVar1 - fVar93) * fVar102;
          fVar48 = (pfVar1[1] - fVar55) * fVar104;
          fVar51 = (pfVar1[2] - fVar63) * fVar106;
          fVar53 = (pfVar1[3] - fVar95) * fVar82;
          uVar45 = (uint)((int)fVar44 < (int)fVar25) * (int)fVar25 |
                   (uint)((int)fVar44 >= (int)fVar25) * (int)fVar44;
          uVar49 = (uint)((int)fVar48 < (int)fVar36) * (int)fVar36 |
                   (uint)((int)fVar48 >= (int)fVar36) * (int)fVar48;
          uVar52 = (uint)((int)fVar51 < (int)fVar38) * (int)fVar38 |
                   (uint)((int)fVar51 >= (int)fVar38) * (int)fVar51;
          uVar54 = (uint)((int)fVar53 < (int)fVar40) * (int)fVar40 |
                   (uint)((int)fVar53 >= (int)fVar40) * (int)fVar53;
          pfVar1 = (float *)((long)&(pIVar20->intersector1).intersect + uVar24);
          fVar25 = (*pfVar1 - fVar59) * fVar81;
          fVar36 = (pfVar1[1] - fVar60) * fVar83;
          fVar38 = (pfVar1[2] - fVar75) * fVar85;
          fVar40 = (pfVar1[3] - auVar47._0_4_) * fVar84;
          uVar26 = (uint)((int)fVar25 < (int)fVar77) * (int)fVar77 |
                   (uint)((int)fVar25 >= (int)fVar77) * (int)fVar25;
          uVar37 = (uint)((int)fVar36 < (int)fVar78) * (int)fVar78 |
                   (uint)((int)fVar36 >= (int)fVar78) * (int)fVar36;
          uVar39 = (uint)((int)fVar38 < (int)fVar79) * (int)fVar79 |
                   (uint)((int)fVar38 >= (int)fVar79) * (int)fVar38;
          uVar41 = (uint)((int)fVar40 < (int)fVar64) * (int)fVar64 |
                   (uint)((int)fVar40 >= (int)fVar64) * (int)fVar40;
          local_10b8[0] =
               (float)(((int)uVar26 < (int)uVar45) * uVar45 | ((int)uVar26 >= (int)uVar45) * uVar26)
          ;
          local_10b8[1] =
               (float)(((int)uVar37 < (int)uVar49) * uVar49 | ((int)uVar37 >= (int)uVar49) * uVar37)
          ;
          local_10b8[2] =
               (float)(((int)uVar39 < (int)uVar52) * uVar52 | ((int)uVar39 >= (int)uVar52) * uVar39)
          ;
          local_10b8[3] =
               (float)(((int)uVar41 < (int)uVar54) * uVar54 | ((int)uVar41 >= (int)uVar54) * uVar41)
          ;
          pfVar1 = (float *)((long)&(pIVar20->intersector1).intersect + ((ulong)bVar9 * 0x10 ^ 0x10)
                            );
          fVar25 = (*pfVar1 - fVar87) * fVar100;
          fVar36 = (pfVar1[1] - fVar89) * fVar76;
          fVar38 = (pfVar1[2] - fVar91) * fVar99;
          fVar40 = (pfVar1[3] - fVar94) * fVar80;
          pfVar1 = (float *)((long)&(pIVar20->intersector1).intersect + (uVar19 ^ 0x10));
          fVar44 = (*pfVar1 - fVar93) * fVar102;
          fVar48 = (pfVar1[1] - fVar55) * fVar104;
          fVar51 = (pfVar1[2] - fVar63) * fVar106;
          fVar53 = (pfVar1[3] - fVar95) * fVar82;
          uVar45 = (uint)((int)fVar25 < (int)fVar44) * (int)fVar25 |
                   (uint)((int)fVar25 >= (int)fVar44) * (int)fVar44;
          uVar49 = (uint)((int)fVar36 < (int)fVar48) * (int)fVar36 |
                   (uint)((int)fVar36 >= (int)fVar48) * (int)fVar48;
          uVar52 = (uint)((int)fVar38 < (int)fVar51) * (int)fVar38 |
                   (uint)((int)fVar38 >= (int)fVar51) * (int)fVar51;
          uVar54 = (uint)((int)fVar40 < (int)fVar53) * (int)fVar40 |
                   (uint)((int)fVar40 >= (int)fVar53) * (int)fVar53;
          pfVar1 = (float *)((long)&(pIVar20->intersector1).intersect + (uVar24 ^ 0x10));
          fVar25 = (*pfVar1 - fVar59) * fVar81;
          fVar36 = (pfVar1[1] - fVar60) * fVar83;
          fVar38 = (pfVar1[2] - fVar75) * fVar85;
          fVar40 = (pfVar1[3] - auVar47._0_4_) * fVar84;
          uVar26 = (uint)((int)fVar58 < (int)fVar25) * (int)fVar58 |
                   (uint)((int)fVar58 >= (int)fVar25) * (int)fVar25;
          uVar37 = (uint)((int)fVar46 < (int)fVar36) * (int)fVar46 |
                   (uint)((int)fVar46 >= (int)fVar36) * (int)fVar36;
          uVar39 = (uint)((int)fVar50 < (int)fVar38) * (int)fVar50 |
                   (uint)((int)fVar50 >= (int)fVar38) * (int)fVar38;
          uVar41 = (uint)((int)fVar68 < (int)fVar40) * (int)fVar68 |
                   (uint)((int)fVar68 >= (int)fVar40) * (int)fVar40;
          auVar56._0_4_ =
               -(uint)((int)(((int)uVar45 < (int)uVar26) * uVar45 |
                            ((int)uVar45 >= (int)uVar26) * uVar26) < (int)local_10b8[0]);
          auVar56._4_4_ =
               -(uint)((int)(((int)uVar49 < (int)uVar37) * uVar49 |
                            ((int)uVar49 >= (int)uVar37) * uVar37) < (int)local_10b8[1]);
          auVar56._8_4_ =
               -(uint)((int)(((int)uVar52 < (int)uVar39) * uVar52 |
                            ((int)uVar52 >= (int)uVar39) * uVar39) < (int)local_10b8[2]);
          auVar56._12_4_ =
               -(uint)((int)(((int)uVar54 < (int)uVar41) * uVar54 |
                            ((int)uVar54 >= (int)uVar41) * uVar41) < (int)local_10b8[3]);
          uVar26 = movmskps((int)This,auVar56);
          This = (Intersectors *)(ulong)uVar26;
          if (uVar26 == 0xf) {
            if (pauVar12 == (undefined1 (*) [16])&local_f78) {
              return;
            }
            goto LAB_00d8cda9;
          }
          bVar22 = (byte)uVar26 ^ 0xf;
          uVar15 = (ulong)pIVar20 & 0xfffffffffffffff0;
          This = (Intersectors *)0x0;
          if (bVar22 != 0) {
            for (; (bVar22 >> (long)This & 1) == 0; This = (Intersectors *)((long)&This->ptr + 1)) {
            }
          }
          pIVar20 = *(Intersectors **)(uVar15 + (long)This * 8);
          uVar26 = bVar22 - 1 & (uint)bVar22;
          if (uVar26 != 0) {
            fVar25 = local_10b8[(long)This];
            lVar23 = 0;
            if (uVar26 != 0) {
              for (; (uVar26 >> lVar23 & 1) == 0; lVar23 = lVar23 + 1) {
              }
            }
            pIVar6 = *(Intersectors **)(uVar15 + lVar23 * 8);
            fVar36 = local_10b8[lVar23];
            uVar26 = uVar26 - 1 & uVar26;
            if (uVar26 == 0) {
              This = pIVar6;
              if ((uint)fVar25 < (uint)fVar36) {
                *(Intersectors **)*pauVar12 = pIVar6;
                *(float *)((long)*pauVar12 + 8) = fVar36;
                pauVar12 = pauVar12 + 1;
              }
              else {
                *(Intersectors **)*pauVar12 = pIVar20;
                *(float *)((long)*pauVar12 + 8) = fVar25;
                pauVar12 = pauVar12 + 1;
                pIVar20 = pIVar6;
              }
            }
            else {
              auVar62._8_4_ = fVar25;
              auVar62._0_8_ = pIVar20;
              auVar62._12_4_ = 0;
              auVar66._8_4_ = fVar36;
              auVar66._0_8_ = pIVar6;
              auVar66._12_4_ = 0;
              This = (Intersectors *)0x0;
              if (uVar26 != 0) {
                for (; (uVar26 >> (long)This & 1) == 0;
                    This = (Intersectors *)((long)&This->ptr + 1)) {
                }
              }
              uVar18 = *(undefined8 *)(uVar15 + (long)This * 8);
              fVar38 = local_10b8[(long)This];
              auVar70._8_4_ = fVar38;
              auVar70._0_8_ = uVar18;
              auVar70._12_4_ = 0;
              auVar67._8_4_ = -(uint)((int)fVar25 < (int)fVar36);
              uVar26 = uVar26 - 1 & uVar26;
              if (uVar26 == 0) {
                auVar67._4_4_ = auVar67._8_4_;
                auVar67._0_4_ = auVar67._8_4_;
                auVar67._12_4_ = auVar67._8_4_;
                auVar65._8_4_ = fVar36;
                auVar65._0_8_ = pIVar6;
                auVar65._12_4_ = 0;
                auVar56 = blendvps(auVar65,auVar62,auVar67);
                auVar27 = blendvps(auVar62,auVar66,auVar67);
                auVar28._8_4_ = -(uint)(auVar56._8_4_ < (int)fVar38);
                auVar28._4_4_ = auVar28._8_4_;
                auVar28._0_4_ = auVar28._8_4_;
                auVar28._12_4_ = auVar28._8_4_;
                auVar61._8_4_ = fVar38;
                auVar61._0_8_ = uVar18;
                auVar61._12_4_ = 0;
                auVar62 = blendvps(auVar61,auVar56,auVar28);
                auVar66 = blendvps(auVar56,auVar70,auVar28);
                auVar29._8_4_ = -(uint)(auVar27._8_4_ < auVar66._8_4_);
                auVar29._4_4_ = auVar29._8_4_;
                auVar29._0_4_ = auVar29._8_4_;
                auVar29._12_4_ = auVar29._8_4_;
                auVar56 = blendvps(auVar66,auVar27,auVar29);
                auVar27 = blendvps(auVar27,auVar66,auVar29);
                *pauVar12 = auVar27;
                pauVar12[1] = auVar56;
                pIVar20 = auVar62._0_8_;
                pauVar12 = pauVar12 + 2;
              }
              else {
                This = (Intersectors *)0x0;
                if (uVar26 != 0) {
                  for (; (uVar26 >> (long)This & 1) == 0;
                      This = (Intersectors *)((long)&This->ptr + 1)) {
                  }
                }
                auVar30._4_4_ = auVar67._8_4_;
                auVar30._0_4_ = auVar67._8_4_;
                auVar30._8_4_ = auVar67._8_4_;
                auVar30._12_4_ = auVar67._8_4_;
                auVar67 = blendvps(auVar66,auVar62,auVar30);
                auVar27 = blendvps(auVar62,auVar66,auVar30);
                auVar69._8_4_ = local_10b8[(long)This];
                auVar69._0_8_ = *(undefined8 *)(uVar15 + (long)This * 8);
                auVar69._12_4_ = 0;
                auVar31._8_4_ = -(uint)((int)fVar38 < (int)local_10b8[(long)This]);
                auVar31._4_4_ = auVar31._8_4_;
                auVar31._0_4_ = auVar31._8_4_;
                auVar31._12_4_ = auVar31._8_4_;
                auVar62 = blendvps(auVar69,auVar70,auVar31);
                auVar56 = blendvps(auVar70,auVar69,auVar31);
                auVar32._8_4_ = -(uint)(auVar27._8_4_ < auVar56._8_4_);
                auVar32._4_4_ = auVar32._8_4_;
                auVar32._0_4_ = auVar32._8_4_;
                auVar32._12_4_ = auVar32._8_4_;
                auVar70 = blendvps(auVar56,auVar27,auVar32);
                auVar27 = blendvps(auVar27,auVar56,auVar32);
                auVar33._8_4_ = -(uint)(auVar67._8_4_ < auVar62._8_4_);
                auVar33._4_4_ = auVar33._8_4_;
                auVar33._0_4_ = auVar33._8_4_;
                auVar33._12_4_ = auVar33._8_4_;
                auVar56 = blendvps(auVar62,auVar67,auVar33);
                auVar66 = blendvps(auVar67,auVar62,auVar33);
                auVar34._8_4_ = -(uint)(auVar66._8_4_ < auVar70._8_4_);
                auVar34._4_4_ = auVar34._8_4_;
                auVar34._0_4_ = auVar34._8_4_;
                auVar34._12_4_ = auVar34._8_4_;
                auVar62 = blendvps(auVar70,auVar66,auVar34);
                auVar66 = blendvps(auVar66,auVar70,auVar34);
                *pauVar12 = auVar27;
                pauVar12[1] = auVar66;
                pauVar12[2] = auVar62;
                pIVar20 = auVar56._0_8_;
                pauVar12 = pauVar12 + 3;
              }
            }
          }
        }
        uVar15 = (ulong)((uint)pIVar20 & 0xf);
        if (uVar15 != 8) {
          uVar21 = (ulong)pIVar20 & 0xfffffffffffffff0;
          lVar23 = 0;
          pauVar13 = pauVar12;
          do {
            This = (Intersectors *)(lVar23 * 0xb0);
            pfVar1 = (float *)((long)&(This->intersector4_nofilter).name + uVar21);
            fVar64 = *pfVar1;
            fVar68 = pfVar1[1];
            fVar94 = pfVar1[2];
            fVar95 = pfVar1[3];
            pfVar1 = (float *)((long)&(This->intersector4).intersect + uVar21);
            auVar47._0_4_ = *pfVar1;
            fVar58 = pfVar1[1];
            fVar59 = pfVar1[2];
            fVar60 = pfVar1[3];
            pfVar1 = (float *)((long)&(This->intersector4_nofilter).intersect + uVar21);
            fVar75 = *pfVar1;
            fVar77 = pfVar1[1];
            fVar78 = pfVar1[2];
            fVar79 = pfVar1[3];
            pfVar1 = (float *)((long)&(This->intersector4).name + uVar21);
            fVar81 = *pfVar1;
            fVar83 = pfVar1[1];
            fVar85 = pfVar1[2];
            fVar84 = pfVar1[3];
            fVar108 = fVar75 * fVar81 - fVar64 * auVar47._0_4_;
            fVar109 = fVar77 * fVar83 - fVar68 * fVar58;
            fVar110 = fVar78 * fVar85 - fVar94 * fVar59;
            fVar111 = fVar79 * fVar84 - fVar95 * fVar60;
            pfVar1 = (float *)((long)&(This->intersector4_filter).occluded + uVar21);
            fVar87 = *pfVar1;
            fVar89 = pfVar1[1];
            fVar91 = pfVar1[2];
            fVar93 = pfVar1[3];
            pfVar1 = (float *)((long)&This->ptr + uVar21);
            pfVar3 = (float *)((long)&(This->collider).collide + uVar21);
            fVar55 = (ray->super_RayK<1>).org.field_0.m128[0];
            fVar63 = (ray->super_RayK<1>).org.field_0.m128[1];
            fVar100 = (ray->super_RayK<1>).org.field_0.m128[2];
            fVar76 = (ray->super_RayK<1>).dir.field_0.m128[0];
            fVar99 = (ray->super_RayK<1>).dir.field_0.m128[1];
            fVar80 = (ray->super_RayK<1>).dir.field_0.m128[2];
            fVar46 = *pfVar1 - fVar55;
            fVar50 = pfVar1[1] - fVar55;
            fVar25 = pfVar1[2] - fVar55;
            fVar55 = pfVar1[3] - fVar55;
            fVar36 = *pfVar3 - fVar63;
            fVar38 = pfVar3[1] - fVar63;
            fVar40 = pfVar3[2] - fVar63;
            fVar63 = pfVar3[3] - fVar63;
            fVar101 = fVar46 * fVar99 - fVar76 * fVar36;
            fVar103 = fVar50 * fVar99 - fVar76 * fVar38;
            fVar105 = fVar25 * fVar99 - fVar76 * fVar40;
            fVar107 = fVar55 * fVar99 - fVar76 * fVar63;
            pfVar1 = (float *)((long)&(This->intersector1).pointQuery + uVar21);
            fVar102 = *pfVar1;
            fVar104 = pfVar1[1];
            fVar106 = pfVar1[2];
            fVar82 = pfVar1[3];
            local_1018._0_4_ = fVar64 * fVar102 - fVar81 * fVar87;
            local_1018._4_4_ = fVar68 * fVar104 - fVar83 * fVar89;
            local_1018._8_4_ = fVar94 * fVar106 - fVar85 * fVar91;
            local_1018._12_4_ = fVar95 * fVar82 - fVar84 * fVar93;
            pfVar1 = (float *)((long)&(This->intersector1).intersect + uVar21);
            fVar96 = *pfVar1 - fVar100;
            fVar97 = pfVar1[1] - fVar100;
            fVar98 = pfVar1[2] - fVar100;
            fVar100 = pfVar1[3] - fVar100;
            fVar86 = fVar76 * fVar96 - fVar46 * fVar80;
            fVar88 = fVar76 * fVar97 - fVar50 * fVar80;
            fVar90 = fVar76 * fVar98 - fVar25 * fVar80;
            fVar92 = fVar76 * fVar100 - fVar55 * fVar80;
            local_1008[0] = auVar47._0_4_ * fVar87 - fVar75 * fVar102;
            local_1008[1] = fVar58 * fVar89 - fVar77 * fVar104;
            local_1008[2] = fVar59 * fVar91 - fVar78 * fVar106;
            local_1008[3] = fVar60 * fVar93 - fVar79 * fVar82;
            fVar44 = fVar80 * fVar36 - fVar99 * fVar96;
            fVar48 = fVar80 * fVar38 - fVar99 * fVar97;
            fVar51 = fVar80 * fVar40 - fVar99 * fVar98;
            fVar53 = fVar80 * fVar63 - fVar99 * fVar100;
            fVar72 = fVar99 * local_1018._0_4_ + fVar80 * local_1008[0] + fVar108 * fVar76;
            fVar73 = fVar99 * local_1018._4_4_ + fVar80 * local_1008[1] + fVar109 * fVar76;
            fVar74 = fVar99 * local_1018._8_4_ + fVar80 * local_1008[2] + fVar110 * fVar76;
            fVar76 = fVar99 * local_1018._12_4_ + fVar80 * local_1008[3] + fVar111 * fVar76;
            uVar37 = (uint)fVar72 & 0x80000000;
            uVar39 = (uint)fVar73 & 0x80000000;
            uVar41 = (uint)fVar74 & 0x80000000;
            uVar45 = (uint)fVar76 & 0x80000000;
            local_10b8[0] =
                 (float)((uint)(fVar87 * fVar44 + fVar75 * fVar86 + fVar64 * fVar101) ^ uVar37);
            local_10b8[1] =
                 (float)((uint)(fVar89 * fVar48 + fVar77 * fVar88 + fVar68 * fVar103) ^ uVar39);
            local_10b8[2] =
                 (float)((uint)(fVar91 * fVar51 + fVar78 * fVar90 + fVar94 * fVar105) ^ uVar41);
            local_10b8[3] =
                 (float)((uint)(fVar93 * fVar53 + fVar79 * fVar92 + fVar95 * fVar107) ^ uVar45);
            local_10a8 = (float)((uint)(fVar44 * fVar102 + fVar86 * auVar47._0_4_ + fVar101 * fVar81
                                       ) ^ uVar37);
            fStack_10a4 = (float)((uint)(fVar48 * fVar104 + fVar88 * fVar58 + fVar103 * fVar83) ^
                                 uVar39);
            fStack_10a0 = (float)((uint)(fVar51 * fVar106 + fVar90 * fVar59 + fVar105 * fVar85) ^
                                 uVar41);
            fStack_109c = (float)((uint)(fVar53 * fVar82 + fVar92 * fVar60 + fVar107 * fVar84) ^
                                 uVar45);
            fVar64 = ABS(fVar72);
            fVar68 = ABS(fVar73);
            local_1088._0_8_ = CONCAT44(fVar73,fVar72) & 0x7fffffff7fffffff;
            local_1088._8_4_ = ABS(fVar74);
            local_1088._12_4_ = ABS(fVar76);
            auVar71._0_4_ =
                 -(uint)(local_10b8[0] + local_10a8 <= fVar64) &
                 -(uint)((0.0 <= local_10a8 && 0.0 <= local_10b8[0]) && fVar72 != 0.0) & local_f88;
            auVar71._4_4_ =
                 -(uint)(local_10b8[1] + fStack_10a4 <= fVar68) &
                 -(uint)((0.0 <= fStack_10a4 && 0.0 <= local_10b8[1]) && fVar73 != 0.0) & uStack_f84
            ;
            auVar71._8_4_ =
                 -(uint)(local_10b8[2] + fStack_10a0 <= local_1088._8_4_) &
                 -(uint)((0.0 <= fStack_10a0 && 0.0 <= local_10b8[2]) && fVar74 != 0.0) & uStack_f80
            ;
            auVar71._12_4_ =
                 -(uint)(local_10b8[3] + fStack_109c <= local_1088._12_4_) &
                 -(uint)((0.0 <= fStack_109c && 0.0 <= local_10b8[3]) && fVar76 != 0.0) & uStack_f7c
            ;
            uVar26 = movmskps((int)pauVar13,auVar71);
            pauVar13 = (undefined1 (*) [16])(ulong)uVar26;
            if (uVar26 != 0) {
              local_1098 = (float)(uVar37 ^ (uint)(fVar46 * fVar108 +
                                                  fVar36 * local_1018._0_4_ + fVar96 * local_1008[0]
                                                  ));
              fStack_1094 = (float)(uVar39 ^ (uint)(fVar50 * fVar109 +
                                                   fVar38 * local_1018._4_4_ +
                                                   fVar97 * local_1008[1]));
              fStack_1090 = (float)(uVar41 ^ (uint)(fVar25 * fVar110 +
                                                   fVar40 * local_1018._8_4_ +
                                                   fVar98 * local_1008[2]));
              fStack_108c = (float)(uVar45 ^ (uint)(fVar55 * fVar111 +
                                                   fVar63 * local_1018._12_4_ +
                                                   fVar100 * local_1008[3]));
              fVar94 = (ray->super_RayK<1>).org.field_0.m128[3];
              auVar5._0_4_ = (ray->super_RayK<1>).tfar;
              auVar5._4_4_ = (ray->super_RayK<1>).mask;
              auVar5._8_4_ = (ray->super_RayK<1>).id;
              auVar5._12_4_ = (ray->super_RayK<1>).flags;
              auVar35._0_4_ =
                   -(uint)(local_1098 <= (float)auVar5._0_4_ * fVar64 &&
                          fVar94 * fVar64 < local_1098) & auVar71._0_4_;
              auVar35._4_4_ =
                   -(uint)(fStack_1094 <= (float)auVar5._0_4_ * fVar68 &&
                          fVar94 * fVar68 < fStack_1094) & auVar71._4_4_;
              auVar35._8_4_ =
                   -(uint)(fStack_1090 <= (float)auVar5._0_4_ * local_1088._8_4_ &&
                          fVar94 * local_1088._8_4_ < fStack_1090) & auVar71._8_4_;
              auVar35._12_4_ =
                   -(uint)(fStack_108c <= (float)auVar5._0_4_ * local_1088._12_4_ &&
                          fVar94 * local_1088._12_4_ < fStack_108c) & auVar71._12_4_;
              uVar26 = movmskps(uVar26,auVar35);
              pauVar13 = (undefined1 (*) [16])(ulong)uVar26;
              if (uVar26 != 0) {
                local_1068 = auVar35;
                local_1028._4_4_ = fVar109;
                local_1028._0_4_ = fVar108;
                local_1028._8_4_ = fVar110;
                local_1028._12_4_ = fVar111;
                local_10f0 = context->scene;
                local_1158 = auVar35;
                auVar47 = rcpps(local_1028,local_1088);
                fVar58 = auVar47._4_4_;
                fVar59 = auVar47._8_4_;
                fVar60 = auVar47._12_4_;
                auVar47._0_4_ = (1.0 - fVar64 * auVar47._0_4_) * auVar47._0_4_ + auVar47._0_4_;
                fVar58 = (1.0 - fVar68 * fVar58) * fVar58 + fVar58;
                fVar59 = (1.0 - local_1088._8_4_ * fVar59) * fVar59 + fVar59;
                fVar60 = (1.0 - local_1088._12_4_ * fVar60) * fVar60 + fVar60;
                fVar64 = local_1098 * auVar47._0_4_;
                fVar68 = fStack_1094 * fVar58;
                fVar94 = fStack_1090 * fVar59;
                fVar95 = fStack_108c * fVar60;
                local_1038[0] = fVar64;
                local_1038[1] = fVar68;
                local_1038[2] = fVar94;
                local_1038[3] = fVar95;
                local_1058[0] = local_10b8[0] * auVar47._0_4_;
                local_1058[1] = local_10b8[1] * fVar58;
                local_1058[2] = local_10b8[2] * fVar59;
                local_1058[3] = local_10b8[3] * fVar60;
                local_1048[0] = auVar47._0_4_ * local_10a8;
                local_1048[1] = fVar58 * fStack_10a4;
                local_1048[2] = fVar59 * fStack_10a0;
                local_1048[3] = fVar60 * fStack_109c;
                auVar10._4_4_ = fVar68;
                auVar10._0_4_ = fVar64;
                auVar10._8_4_ = fVar94;
                auVar10._12_4_ = fVar95;
                auVar27 = blendvps(_DAT_01f7a9f0,auVar10,auVar35);
                auVar57._4_4_ = auVar27._0_4_;
                auVar57._0_4_ = auVar27._4_4_;
                auVar57._8_4_ = auVar27._12_4_;
                auVar57._12_4_ = auVar27._8_4_;
                auVar47 = minps(auVar57,auVar27);
                auVar42._0_8_ = auVar47._8_8_;
                auVar42._8_4_ = auVar47._0_4_;
                auVar42._12_4_ = auVar47._4_4_;
                auVar47 = minps(auVar42,auVar47);
                auVar43._0_8_ =
                     CONCAT44(-(uint)(auVar47._4_4_ == auVar27._4_4_) & auVar35._4_4_,
                              -(uint)(auVar47._0_4_ == auVar27._0_4_) & auVar35._0_4_);
                auVar43._8_4_ = -(uint)(auVar47._8_4_ == auVar27._8_4_) & auVar35._8_4_;
                auVar43._12_4_ = -(uint)(auVar47._12_4_ == auVar27._12_4_) & auVar35._12_4_;
                iVar11 = movmskps((int)local_10f0,auVar43);
                if (iVar11 != 0) {
                  auVar35._8_4_ = auVar43._8_4_;
                  auVar35._0_8_ = auVar43._0_8_;
                  auVar35._12_4_ = auVar43._12_4_;
                }
                This = (Intersectors *)((long)&This->ptr + uVar21);
                local_1188 = extractps(auVar5,1);
                auVar47._4_4_ = movmskps(iVar11,auVar35);
                uVar14 = CONCAT44((int)((ulong)local_10f0 >> 0x20),auVar47._4_4_);
                piVar16 = (int *)0x0;
                auVar47._0_4_ = (float)auVar5._0_4_;
                auVar47._4_4_ = auVar5._4_4_;
                auVar47._8_4_ = auVar5._8_4_;
                auVar47._12_4_ = auVar5._12_4_;
                if (uVar14 != 0) {
                  for (; (uVar14 >> (long)piVar16 & 1) == 0; piVar16 = (int *)((long)piVar16 + 1)) {
                  }
                }
                do {
                  uVar26 = *(uint *)((long)&(This->intersector8).occluded + (long)piVar16 * 4);
                  pGVar7 = (local_10f0->geometries).items[uVar26].ptr;
                  if ((pGVar7->mask & (uint)local_1188) == 0) {
                    *(undefined4 *)(local_1158 + (long)piVar16 * 4) = 0;
                  }
                  else {
                    pRVar8 = context->args;
                    if (pRVar8->filter == (RTCFilterFunctionN)0x0) {
                      pRVar17 = context->user;
                      if (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                        fVar64 = local_1058[(long)piVar16];
                        fVar68 = local_1048[(long)piVar16];
                        (ray->super_RayK<1>).tfar = local_1038[(long)piVar16];
                        (ray->Ng).field_0.field_0.x = *(float *)(local_1028 + (long)piVar16 * 4);
                        (ray->Ng).field_0.field_0.y = *(float *)(local_1018 + (long)piVar16 * 4);
                        (ray->Ng).field_0.field_0.z = local_1008[(long)piVar16];
                        ray->u = fVar64;
                        ray->v = fVar68;
                        uVar37 = *(uint *)((long)&(This->intersector8_filter).intersect +
                                          (long)piVar16 * 4);
                        This = (Intersectors *)(ulong)uVar37;
                        ray->primID = uVar37;
                        ray->geomID = uVar26;
                        ray->instID[0] = pRVar17->instID[0];
                        pauVar13 = (undefined1 (*) [16])(ulong)pRVar17->instPrimID[0];
                        ray->instPrimID[0] = pRVar17->instPrimID[0];
                        break;
                      }
                      local_1148 = auVar47._0_4_;
                      uStack_1144 = auVar47._4_4_;
                      uStack_1140 = auVar47._8_4_;
                      uStack_113c = auVar47._12_4_;
                      local_1138 = fVar64;
                      fStack_1134 = fVar68;
                      fStack_1130 = fVar94;
                      fStack_112c = fVar95;
                    }
                    else {
                      local_1148 = auVar47._0_4_;
                      uStack_1144 = auVar47._4_4_;
                      uStack_1140 = auVar47._8_4_;
                      uStack_113c = auVar47._12_4_;
                      local_1138 = fVar64;
                      fStack_1134 = fVar68;
                      fStack_1130 = fVar94;
                      fStack_112c = fVar95;
                      pRVar17 = context->user;
                    }
                    local_10e8 = *(float *)(local_1028 + (long)piVar16 * 4);
                    local_10e4 = *(undefined4 *)(local_1018 + (long)piVar16 * 4);
                    local_10e0 = local_1008[(long)piVar16];
                    local_10dc = local_1058[(long)piVar16];
                    local_10d8 = local_1048[(long)piVar16];
                    local_10d4 = *(undefined4 *)
                                  ((long)&(This->intersector8_filter).intersect + (long)piVar16 * 4)
                    ;
                    local_10d0 = uVar26;
                    local_10cc = pRVar17->instID[0];
                    local_10c8 = pRVar17->instPrimID[0];
                    (ray->super_RayK<1>).tfar = local_1038[(long)piVar16];
                    local_115c = -1;
                    local_1128.valid = &local_115c;
                    local_1128.geometryUserPtr = pGVar7->userPtr;
                    local_1128.context = pRVar17;
                    local_1128.ray = (RTCRayN *)ray;
                    local_1128.hit = (RTCHitN *)&local_10e8;
                    local_1128.N = 1;
                    local_10f8 = pGVar7;
                    local_1148 = auVar47._0_4_;
                    uStack_1144 = auVar47._4_4_;
                    uStack_1140 = auVar47._8_4_;
                    uStack_113c = auVar47._12_4_;
                    local_1138 = fVar64;
                    fStack_1134 = fVar68;
                    fStack_1130 = fVar94;
                    fStack_112c = fVar95;
                    if (((pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                        ((*pGVar7->intersectionFilterN)(&local_1128), *local_1128.valid != 0)) &&
                       ((pRVar8->filter == (RTCFilterFunctionN)0x0 ||
                        ((((pRVar8->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                           RTC_RAY_QUERY_FLAG_INCOHERENT &&
                          (((local_10f8->field_8).field_0x2 & 0x40) == 0)) ||
                         ((*pRVar8->filter)(&local_1128), *local_1128.valid != 0)))))) {
                      (((Vec3f *)((long)local_1128.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_1128.hit;
                      (((Vec3f *)((long)local_1128.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_1128.hit + 4);
                      (((Vec3f *)((long)local_1128.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_1128.hit + 8);
                      *(float *)((long)local_1128.ray + 0x3c) = *(float *)(local_1128.hit + 0xc);
                      *(float *)((long)local_1128.ray + 0x40) = *(float *)(local_1128.hit + 0x10);
                      *(float *)((long)local_1128.ray + 0x44) = *(float *)(local_1128.hit + 0x14);
                      *(float *)((long)local_1128.ray + 0x48) = *(float *)(local_1128.hit + 0x18);
                      *(float *)((long)local_1128.ray + 0x4c) = *(float *)(local_1128.hit + 0x1c);
                      *(float *)((long)local_1128.ray + 0x50) = *(float *)(local_1128.hit + 0x20);
                    }
                    else {
                      (ray->super_RayK<1>).tfar = local_1148;
                    }
                    *(undefined4 *)(local_1158 + (long)piVar16 * 4) = 0;
                    auVar47._0_4_ = (ray->super_RayK<1>).tfar;
                    auVar47._4_4_ = (ray->super_RayK<1>).mask;
                    auVar47._8_4_ = (ray->super_RayK<1>).id;
                    auVar47._12_4_ = (ray->super_RayK<1>).flags;
                    local_1158._0_4_ = -(uint)(local_1138 <= auVar47._0_4_) & local_1158._0_4_;
                    local_1158._4_4_ = -(uint)(fStack_1134 <= auVar47._0_4_) & local_1158._4_4_;
                    local_1158._8_4_ = -(uint)(fStack_1130 <= auVar47._0_4_) & local_1158._8_4_;
                    local_1158._12_4_ = -(uint)(fStack_112c <= auVar47._0_4_) & local_1158._12_4_;
                    uVar18 = extractps(auVar47,1);
                    local_1188._0_4_ = (uint)uVar18;
                    fVar64 = local_1138;
                    fVar68 = fStack_1134;
                    fVar94 = fStack_1130;
                    fVar95 = fStack_112c;
                  }
                  local_1188 = (ulong)(uint)local_1188;
                  local_1148 = auVar47._0_4_;
                  uStack_1144 = auVar47._4_4_;
                  uStack_1140 = auVar47._8_4_;
                  uStack_113c = auVar47._12_4_;
                  uVar26 = movmskps((int)piVar16,local_1158);
                  pauVar13 = (undefined1 (*) [16])(ulong)uVar26;
                  if (uVar26 == 0) break;
                  local_1138 = fVar64;
                  fStack_1134 = fVar68;
                  fStack_1130 = fVar94;
                  fStack_112c = fVar95;
                  BVHNIntersector1<4,1,false,embree::sse42::ArrayIntersector1<embree::sse42::TriangleMIntersector1Moeller<4,true>>>
                  ::intersect();
                  piVar16 = local_1128.valid;
                  auVar47._0_4_ = local_1148;
                  auVar47._4_4_ = uStack_1144;
                  auVar47._8_4_ = uStack_1140;
                  auVar47._12_4_ = uStack_113c;
                  fVar64 = local_1138;
                  fVar68 = fStack_1134;
                  fVar94 = fStack_1130;
                  fVar95 = fStack_112c;
                } while( true );
              }
            }
            lVar23 = lVar23 + 1;
          } while (lVar23 != uVar15 - 8);
        }
        fVar58 = (ray->super_RayK<1>).tfar;
        fVar59 = local_f98;
        fVar60 = fStack_f94;
        fVar75 = fStack_f90;
        auVar47._0_4_ = fStack_f8c;
        fVar77 = local_fa8;
        fVar78 = fStack_fa4;
        fVar79 = fStack_fa0;
        fVar64 = fStack_f9c;
        fVar81 = local_fb8;
        fVar83 = fStack_fb4;
        fVar85 = fStack_fb0;
        fVar84 = fStack_fac;
        fVar87 = local_fc8;
        fVar89 = fStack_fc4;
        fVar91 = fStack_fc0;
        fVar94 = fStack_fbc;
        fVar93 = local_fd8;
        fVar55 = fStack_fd4;
        fVar63 = fStack_fd0;
        fVar95 = fStack_fcc;
        fVar100 = local_fe8;
        fVar76 = fStack_fe4;
        fVar99 = fStack_fe0;
        fVar80 = fStack_fdc;
        fVar102 = local_ff8;
        fVar104 = fStack_ff4;
        fVar106 = fStack_ff0;
        fVar82 = fStack_fec;
        fVar46 = fVar58;
        fVar50 = fVar58;
        fVar68 = fVar58;
      }
    } while (pauVar12 != (undefined1 (*) [16])&local_f78);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }